

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

int addBinding(XML_Parser parser,PREFIX *prefix,ATTRIBUTE_ID *attId,XML_Char *uri,
              BINDING **bindingsPtr)

{
  long lVar1;
  char cVar2;
  XML_Char *__dest;
  BINDING *pBVar3;
  BINDING *pBVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  
  lVar1 = 0;
  do {
    lVar5 = lVar1;
    lVar1 = lVar5 + 1;
  } while (uri[lVar5] != '\0');
  cVar2 = *(char *)((long)parser + 0x488);
  uVar8 = (lVar5 - (ulong)(cVar2 == '\0')) + 1;
  pBVar3 = *(BINDING **)((long)parser + 1000);
  iVar7 = (int)uVar8;
  if (pBVar3 == (BINDING *)0x0) {
    pBVar3 = (BINDING *)(**(code **)((long)parser + 0x18))(0x30);
    if (pBVar3 != (BINDING *)0x0) {
      uVar6 = (lVar1 - (ulong)(cVar2 == '\0')) + 0x18;
      __dest = (XML_Char *)(**(code **)((long)parser + 0x18))(uVar6 & 0xffffffff);
      pBVar3->uri = __dest;
      if (__dest != (XML_Char *)0x0) {
        pBVar3->uriAlloc = (int)uVar6;
        goto LAB_0046ec6b;
      }
      (**(code **)((long)parser + 0x28))(pBVar3);
    }
LAB_0046ed03:
    iVar7 = 0;
  }
  else {
    if (pBVar3->uriAlloc < iVar7) {
      uVar6 = (lVar1 - (ulong)(cVar2 == '\0')) + 0x18;
      __dest = (XML_Char *)(**(code **)((long)parser + 0x20))(pBVar3->uri,uVar6 & 0xffffffff);
      pBVar3->uri = __dest;
      if (__dest == (XML_Char *)0x0) goto LAB_0046ed03;
      pBVar3->uriAlloc = (int)uVar6;
    }
    else {
      __dest = pBVar3->uri;
    }
    *(binding **)((long)parser + 1000) = pBVar3->nextTagBinding;
LAB_0046ec6b:
    pBVar3->uriLen = iVar7;
    uVar8 = uVar8 & 0xffffffff;
    memcpy(__dest,uri,uVar8);
    if (*(char *)((long)parser + 0x488) != '\0') {
      pBVar3->uri[uVar8 - 1] = *(char *)((long)parser + 0x488);
    }
    pBVar3->prefix = prefix;
    pBVar3->attId = attId;
    pBVar3->prevPrefixBinding = prefix->binding;
    pBVar4 = (BINDING *)0x0;
    if ((PREFIX *)((long)parser + 0x390) != prefix) {
      pBVar4 = pBVar3;
    }
    if (*uri != '\0') {
      pBVar4 = pBVar3;
    }
    prefix->binding = pBVar4;
    pBVar3->nextTagBinding = *bindingsPtr;
    *bindingsPtr = pBVar3;
    iVar7 = 1;
    if (*(code **)((long)parser + 200) != (code *)0x0) {
      if (prefix->binding == (BINDING *)0x0) {
        uri = (XML_Char *)0x0;
      }
      (**(code **)((long)parser + 200))(*(undefined8 *)((long)parser + 8),prefix->name,uri);
    }
  }
  return iVar7;
}

Assistant:

static
int addBinding(XML_Parser parser, PREFIX *prefix, const ATTRIBUTE_ID *attId, const XML_Char *uri, BINDING **bindingsPtr)
{
  BINDING *b;
  int len;
  for (len = 0; uri[len]; len++)
    ;
  if (namespaceSeparator)
    len++;
  if (freeBindingList) {
    b = freeBindingList;
    if (len > b->uriAlloc) {
      b->uri = REALLOC(b->uri, sizeof(XML_Char) * (len + EXPAND_SPARE));
      if (!b->uri)
        return 0;
      b->uriAlloc = len + EXPAND_SPARE;
    }
    freeBindingList = b->nextTagBinding;
  }
  else {
    b = MALLOC(sizeof(BINDING));
    if (!b)
      return 0;
    b->uri = MALLOC(sizeof(XML_Char) * (len + EXPAND_SPARE));
    if (!b->uri) {
      FREE(b);
      return 0;
    }
    b->uriAlloc = len + EXPAND_SPARE;
  }
  b->uriLen = len;
  memcpy(b->uri, uri, len * sizeof(XML_Char));
  if (namespaceSeparator)
    b->uri[len - 1] = namespaceSeparator;
  b->prefix = prefix;
  b->attId = attId;
  b->prevPrefixBinding = prefix->binding;
  if (*uri == XML_T('\0') && prefix == &dtd.defaultPrefix)
    prefix->binding = 0;
  else
    prefix->binding = b;
  b->nextTagBinding = *bindingsPtr;
  *bindingsPtr = b;
  if (startNamespaceDeclHandler)
    startNamespaceDeclHandler(handlerArg, prefix->name,
                              prefix->binding ? uri : 0);
  return 1;
}